

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

int Aig_ManChoiceNum(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) {
      iVar1 = Aig_ObjIsChoice(p,pObj_00);
      local_20 = iVar1 + local_20;
    }
  }
  return local_20;
}

Assistant:

int Aig_ManChoiceNum( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        Counter += Aig_ObjIsChoice( p, pObj );
    return Counter;
}